

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AddressFilter.cpp
# Opt level: O3

IPAsKeyLRU * __thiscall IPAsKeyLRU::CreateCopy(IPAsKeyLRU *this)

{
  ulong uVar1;
  uint32_t uVar2;
  IPAsKeyLRU *pIVar3;
  size_t __n;
  
  pIVar3 = (IPAsKeyLRU *)operator_new(0x48);
  uVar1 = (this->super_IPAsKey).addr_len;
  (pIVar3->super_IPAsKey).HashNext = (IPAsKey *)0x0;
  __n = 0x10;
  if (uVar1 < 0x10) {
    __n = uVar1;
  }
  memcpy((pIVar3->super_IPAsKey).addr,(this->super_IPAsKey).addr,__n);
  (pIVar3->super_IPAsKey).addr_len = __n;
  (pIVar3->super_IPAsKey)._vptr_IPAsKey = (_func_int **)&PTR__IPAsKeyLRU_001ac550;
  pIVar3->MoreRecentKey = (IPAsKeyLRU *)0x0;
  pIVar3->LessRecentKey = (IPAsKeyLRU *)0x0;
  uVar2 = (this->super_IPAsKey).hash;
  (pIVar3->super_IPAsKey).count = (this->super_IPAsKey).count;
  (pIVar3->super_IPAsKey).hash = uVar2;
  return pIVar3;
}

Assistant:

IPAsKeyLRU * IPAsKeyLRU::CreateCopy()
{
    IPAsKeyLRU * x = new IPAsKeyLRU(addr, addr_len);

    if (x != NULL)
    {
        x->count = count;
        x->hash = hash;
    }

    return x;
}